

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmInstructionType
anon_unknown.dwarf_c91b1::GetMirroredComparisonOperationWithLoad(VmInstructionType cmd)

{
  VmInstructionType local_c;
  VmInstructionType cmd_local;
  
  switch(cmd) {
  case VM_INST_LESS:
    local_c = VM_INST_GREATER_LOAD;
    break;
  case VM_INST_GREATER:
    local_c = VM_INST_LESS_LOAD;
    break;
  case VM_INST_LESS_EQUAL:
    local_c = VM_INST_GREATER_EQUAL_LOAD;
    break;
  case VM_INST_GREATER_EQUAL:
    local_c = VM_INST_LESS_EQUAL_LOAD;
    break;
  default:
    __assert_fail("!\"unknown operation\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x121,
                  "VmInstructionType (anonymous namespace)::GetMirroredComparisonOperationWithLoad(VmInstructionType)"
                 );
  }
  return local_c;
}

Assistant:

VmInstructionType GetMirroredComparisonOperationWithLoad(VmInstructionType cmd)
	{
		switch(cmd)
		{
		case VM_INST_LESS:
			return VM_INST_GREATER_LOAD;
		case VM_INST_GREATER:
			return VM_INST_LESS_LOAD;
		case VM_INST_LESS_EQUAL:
			return VM_INST_GREATER_EQUAL_LOAD;
		case VM_INST_GREATER_EQUAL:
			return VM_INST_LESS_EQUAL_LOAD;
		default:
			break;
		}

		assert(!"unknown operation");
		return VM_INST_ABORT_NO_RETURN;
	}